

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  uint32_t f_1;
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint32_t q;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint32_t r;
  uint uVar14;
  bool bVar15;
  uint32_t c1;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 local_54;
  
  d.v[8] = 0;
  d.v[4] = 0;
  d.v[5] = 0;
  d.v[6] = 0;
  d.v[7] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v[8] = x->v[8];
  g.v._0_8_ = *(undefined8 *)x->v;
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar8 = 0xffffffff;
  for (iVar1 = 0; iVar1 != 0x14; iVar1 = iVar1 + 1) {
    lVar4 = (long)f.v[0];
    lVar11 = (long)g.v[0];
    uVar7 = 0;
    iVar3 = 0x1e;
    uVar12 = 1;
    uVar14 = 1;
    uVar13 = 0;
    uVar2 = f.v[0];
    uVar9 = g.v[0];
    while( true ) {
      bVar15 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar15) break;
      uVar5 = (int)uVar8 >> 0x1f;
      uVar6 = -(uVar9 & 1);
      uVar9 = ((uVar5 ^ uVar2) - uVar5 & uVar6) + uVar9;
      uVar7 = uVar7 + ((uVar5 ^ uVar12) - uVar5 & uVar6);
      uVar14 = uVar14 + ((uVar5 ^ uVar13) - uVar5 & uVar6);
      uVar6 = uVar6 & uVar5;
      uVar8 = (uVar8 ^ uVar6) - 1;
      uVar2 = uVar2 + (uVar9 & uVar6);
      uVar9 = uVar9 >> 1;
      uVar12 = ((uVar7 & uVar6) + uVar12) * 2;
      uVar13 = ((uVar6 & uVar14) + uVar13) * 2;
    }
    t.u = uVar12;
    t.v = uVar13;
    t.q = uVar7;
    t.r = uVar14;
    secp256k1_modinv32_update_de_30(&d,&local_54,&t,modinfo);
    lVar10 = (int)uVar13 * lVar11 + (int)uVar12 * lVar4;
    lVar11 = lVar11 * (int)uVar14 + lVar4 * (int)uVar7;
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 8) break;
      lVar10 = (long)f.v[lVar4 + 1] * (long)(int)uVar12 + (lVar10 >> 0x1e) +
               (long)g.v[lVar4 + 1] * (long)(int)uVar13;
      lVar11 = (long)f.v[lVar4 + 1] * (long)(int)uVar7 + (lVar11 >> 0x1e) +
               (long)g.v[lVar4 + 1] * (long)(int)uVar14;
      f.v[lVar4] = (uint)lVar10 & 0x3fffffff;
      g.v[lVar4] = (uint)lVar11 & 0x3fffffff;
      lVar4 = lVar4 + 1;
    }
    f.v[8] = (int32_t)(lVar10 >> 0x1e);
    g.v[8] = (int32_t)(lVar11 >> 0x1e);
  }
  secp256k1_modinv32_normalize_30(&d,f.v[8],modinfo);
  x->v[8] = d.v[8];
  *(undefined8 *)(x->v + 4) = d.v._16_8_;
  *(undefined8 *)(x->v + 6) = d.v._24_8_;
  *(undefined8 *)x->v = d.v._0_8_;
  *(undefined8 *)(x->v + 2) = d.v._8_8_;
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}